

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QString * styleStringHelper(int weight,Style style)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString result;
  QString *in_stack_fffffffffffffe58;
  QString *in_stack_fffffffffffffe60;
  QString *a;
  QStringBuilder<char16_t,_QString> *in_stack_fffffffffffffe88;
  QString *in_stack_fffffffffffffe90;
  char local_160 [30];
  undefined2 local_142;
  char local_120 [30];
  undefined2 local_102;
  char local_e0 [24];
  char local_c8 [24];
  char local_b0 [24];
  char local_98 [24];
  char local_80 [24];
  char local_68 [24];
  char local_50 [24];
  char local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  a = in_RDI;
  QString::QString((QString *)0x740e0c);
  if (in_ESI < 0x191) {
    if (in_ESI < 0x65) {
      QCoreApplication::translate(local_b0,"QFontDatabase","Thin",0);
      QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x74101e);
    }
    else if (in_ESI < 0xc9) {
      QCoreApplication::translate(local_c8,"QFontDatabase","Extra Light",0);
      QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x741074);
    }
    else if (in_ESI < 0x12d) {
      QCoreApplication::translate(local_e0,"QFontDatabase","Light",0);
      QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x7410c7);
    }
  }
  else if (in_ESI < 900) {
    if (in_ESI < 800) {
      if (in_ESI < 700) {
        if (in_ESI < 600) {
          if (499 < in_ESI) {
            QCoreApplication::translate(local_98,"QFontDatabase","Medium",0xbcc15f);
            QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            QString::~QString((QString *)0x740fc3);
          }
        }
        else {
          QCoreApplication::translate(local_80,"QFontDatabase","Demi Bold",0);
          QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          QString::~QString((QString *)0x740f6d);
        }
      }
      else {
        QCoreApplication::translate(local_68,"QFontDatabase","Bold",0);
        QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        QString::~QString((QString *)0x740f17);
      }
    }
    else {
      QCoreApplication::translate(local_50,"QFontDatabase","Extra Bold",0);
      QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x740ec1);
    }
  }
  else {
    QCoreApplication::translate(local_38,"QFontDatabase","Black",0);
    QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QString::~QString((QString *)0x740e6b);
  }
  if (in_EDX == 1) {
    local_102 = 0x20;
    QCoreApplication::translate(local_120,"QFontDatabase","Italic",0);
    operator+((char16_t *)a,in_stack_fffffffffffffe60);
    operator+=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    QStringBuilder<char16_t,_QString>::~QStringBuilder
              ((QStringBuilder<char16_t,_QString> *)0x741142);
    QString::~QString((QString *)0x74114f);
  }
  else if (in_EDX == 2) {
    local_142 = 0x20;
    QCoreApplication::translate(local_160,"QFontDatabase","Oblique",0);
    operator+((char16_t *)a,in_stack_fffffffffffffe60);
    operator+=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    QStringBuilder<char16_t,_QString>::~QStringBuilder
              ((QStringBuilder<char16_t,_QString> *)0x7411b1);
    QString::~QString((QString *)0x7411bb);
  }
  bVar1 = QString::isEmpty((QString *)0x7411ca);
  if (bVar1) {
    QCoreApplication::translate(&stack0xfffffffffffffe88,"QFontDatabase","Normal",0xbcc12c);
    QString::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QString::~QString((QString *)0x741211);
  }
  QString::simplified(in_stack_fffffffffffffe58);
  QString::~QString((QString *)0x741232);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString styleStringHelper(int weight, QFont::Style style)
{
    QString result;
    if (weight > QFont::Normal) {
        if (weight >= QFont::Black)
            result = QCoreApplication::translate("QFontDatabase", "Black");
        else if (weight >= QFont::ExtraBold)
            result = QCoreApplication::translate("QFontDatabase", "Extra Bold");
        else if (weight >= QFont::Bold)
            result = QCoreApplication::translate("QFontDatabase", "Bold");
        else if (weight >= QFont::DemiBold)
            result = QCoreApplication::translate("QFontDatabase", "Demi Bold");
        else if (weight >= QFont::Medium)
            result = QCoreApplication::translate("QFontDatabase", "Medium", "The Medium font weight");
    } else {
        if (weight <= QFont::Thin)
            result = QCoreApplication::translate("QFontDatabase", "Thin");
        else if (weight <= QFont::ExtraLight)
            result = QCoreApplication::translate("QFontDatabase", "Extra Light");
        else if (weight <= QFont::Light)
            result = QCoreApplication::translate("QFontDatabase", "Light");
    }

    if (style == QFont::StyleItalic)
        result += u' ' + QCoreApplication::translate("QFontDatabase", "Italic");
    else if (style == QFont::StyleOblique)
        result += u' ' + QCoreApplication::translate("QFontDatabase", "Oblique");

    if (result.isEmpty())
        result = QCoreApplication::translate("QFontDatabase", "Normal", "The Normal or Regular font weight");

    return result.simplified();
}